

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_std.h
# Opt level: O3

double __thiscall
mp::ComputeValue<std::vector<double,std::allocator<double>>>
          (mp *this,QuadraticObjective *obj,vector<double,_std::allocator<double>_> *x)

{
  long lVar1;
  longdouble in_ST0;
  double dVar2;
  double dVar3;
  
  lVar1 = *(long *)(this + 0x18);
  dVar2 = 0.0;
  if (lVar1 != 0) {
    x = *(vector<double,_std::allocator<double>_> **)(this + 0x50);
    dVar2 = 0.0;
    do {
      dVar2 = *(double *)(*(long *)(this + 8) + -8 + lVar1 * 8) *
              *(double *)
               (*(long *)&(obj->super_NLObjective).super_LinearObjective +
               (long)*(int *)((long)x + lVar1 * 4 + -4) * 8) + dVar2;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  QuadTerms::ComputeValue<std::vector<double,std::allocator<double>>>
            ((longdouble *)(this + 0xa8),(QuadTerms *)obj,x);
  dVar3 = 0.0;
  if (-1 < (long)*(int *)(this + 0xa0)) {
    dVar3 = *(double *)
             (*(long *)&(obj->super_NLObjective).super_LinearObjective +
             (long)*(int *)(this + 0xa0) * 8);
  }
  return dVar2 + (double)in_ST0 + dVar3;
}

Assistant:

double ComputeValue(
    const QuadraticObjective& obj, const VarVec& x) {
  double linp = obj.GetLinTerms().ComputeValue(x);
  double qp = obj.GetQPTerms().ComputeValue(x);
  double nlp = (obj.HasExpr() ? x[obj.ExprIndex()] : 0.0);
  return linp + qp + nlp;
}